

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polynom.h
# Opt level: O0

Polynom<Finite> __thiscall Polynom<Finite>::operator*(Polynom<Finite> *this,Finite *f)

{
  Polynom<Finite> *pPVar1;
  Finite *extraout_RDX;
  Finite *in_RDI;
  Polynom<Finite> PVar2;
  Polynom<Finite> temp;
  Finite *in_stack_ffffffffffffff88;
  Finite *this_00;
  Finite *in_stack_ffffffffffffffc8;
  Polynom<Finite> *in_stack_ffffffffffffffd0;
  
  this_00 = in_RDI;
  Polynom((Polynom<Finite> *)in_RDI,(Polynom<Finite> *)in_stack_ffffffffffffff88);
  Finite::Finite(this_00,in_stack_ffffffffffffff88);
  pPVar1 = operator*=(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  Polynom((Polynom<Finite> *)this_00,pPVar1);
  Finite::~Finite((Finite *)0x11b234);
  ~Polynom((Polynom<Finite> *)0x11b23e);
  PVar2.m.arr = extraout_RDX;
  PVar2.m._0_8_ = in_RDI;
  return (Polynom<Finite>)PVar2.m;
}

Assistant:

inline const Polynom operator*(Field f) const
    {
        Polynom temp(*this);
        return temp *= f;
    }